

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O1

bool __thiscall cmGeneratorTarget::HasSOName(cmGeneratorTarget *this,string *config)

{
  cmMakefile *this_00;
  pointer pcVar1;
  bool bVar2;
  TargetType TVar3;
  LinkClosure *pLVar4;
  char *pcVar5;
  bool bVar6;
  string local_70;
  string local_50;
  
  TVar3 = cmTarget::GetType(this->Target);
  if (TVar3 == SHARED_LIBRARY) {
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    local_50.field_2._M_allocated_capacity = 0x4d414e4f535f4f4e;
    local_50.field_2._8_2_ = 0x45;
    local_50._M_string_length = 9;
    bVar2 = cmTarget::GetPropertyAsBool(this->Target,&local_50);
    if (!bVar2) {
      this_00 = this->Makefile;
      pLVar4 = GetLinkClosure(this,config);
      local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
      pcVar1 = (pLVar4->LinkerLanguage)._M_dataplus._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_70,pcVar1,pcVar1 + (pLVar4->LinkerLanguage)._M_string_length);
      pcVar5 = cmMakefile::GetSONameFlag(this_00,&local_70);
      bVar6 = pcVar5 != (char *)0x0;
      bVar2 = true;
      goto LAB_0034086a;
    }
  }
  bVar2 = false;
  bVar6 = false;
LAB_0034086a:
  if ((bVar2) &&
     ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2)) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  if ((TVar3 == SHARED_LIBRARY) &&
     ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2)) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  return bVar6;
}

Assistant:

bool cmGeneratorTarget::HasSOName(const std::string& config) const
{
  // soname is supported only for shared libraries and modules,
  // and then only when the platform supports an soname flag.
  return ((this->GetType() == cmStateEnums::SHARED_LIBRARY) &&
          !this->GetPropertyAsBool("NO_SONAME") &&
          this->Makefile->GetSONameFlag(this->GetLinkerLanguage(config)));
}